

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell.h
# Opt level: O2

S2Point * __thiscall S2Cell::GetCenter(S2Point *__return_storage_ptr__,S2Cell *this)

{
  S2Point SStack_28;
  
  GetCenterRaw(&SStack_28,this);
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize
            (__return_storage_ptr__,(BasicVector<Vector3,_double,_3UL> *)&SStack_28);
  return __return_storage_ptr__;
}

Assistant:

S2Point GetCenter() const { return GetCenterRaw().Normalize(); }